

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>::
MatchAndExplain<pstore::small_vector<unsigned_char,128ul>>
          (ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>> *this,
          small_vector<unsigned_char,_128UL> *lhs,MatchResultListener *listener)

{
  uchar *puVar1;
  ostream *os;
  bool bVar2;
  pointer_based_iterator<const_unsigned_char> it;
  uchar *puVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  uchar *puVar7;
  uchar *puVar8;
  char *pcVar9;
  
  bVar2 = pstore::operator==(lhs,(small_vector<unsigned_char,_128UL> *)this);
  if ((!bVar2) && (os = listener->stream_, os != (ostream *)0x0)) {
    if (lhs->elements_ == 0) {
      pcVar9 = "which";
    }
    else {
      puVar8 = lhs->buffer_;
      bVar6 = false;
      do {
        lVar4 = *(long *)this;
        puVar3 = *(uchar **)(this + 0xa0);
        puVar1 = puVar3 + lVar4;
        puVar7 = puVar1;
        if (lVar4 != 0) {
          do {
            puVar7 = puVar3;
            if (*puVar3 == *puVar8) break;
            puVar3 = puVar3 + 1;
            lVar4 = lVar4 + -1;
            puVar7 = puVar1;
          } while (lVar4 != 0);
        }
        if (puVar7 == puVar1) {
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar6 = true;
          }
          PrintTo(*puVar8,os);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != lhs->buffer_ + lhs->elements_);
      pcVar9 = "which";
      if (bVar6) {
        pcVar9 = ",\nand";
      }
    }
    if (*(long *)this != 0) {
      puVar8 = *(uchar **)(this + 0xa0);
      bVar6 = false;
      do {
        sVar5 = lhs->elements_;
        puVar3 = lhs->buffer_;
        puVar1 = puVar3 + sVar5;
        puVar7 = puVar1;
        if (sVar5 != 0) {
          do {
            puVar7 = puVar3;
            if (*puVar3 == *puVar8) break;
            puVar3 = puVar3 + 1;
            sVar5 = sVar5 - 1;
            puVar7 = puVar1;
          } while (sVar5 != 0);
        }
        if (puVar7 == puVar1) {
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (os," doesn\'t have these expected elements: ",0x27);
            bVar6 = true;
          }
          PrintTo(*puVar8,os);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != (uchar *)(*(long *)(this + 0xa0) + *(long *)this));
    }
  }
  return bVar2;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }